

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void live_mode_cb(Fl_Button *o,void *param_2)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  Fl_Window *pFVar4;
  Fl_Group *this;
  Fl_Widget *this_00;
  Fl_Button *pFVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  pFVar5 = wLiveMode;
  if (o == (Fl_Button *)0x0) {
    Fl_Button::value(wLiveMode,0);
    o = pFVar5;
  }
  if (o->value_ != '\0') {
    if (numselected == 1) {
      Fl_Group::current((Fl_Group *)0x0);
      iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x13])();
      live_mode_cb::live_widget = (Fl_Widget *)CONCAT44(extraout_var,iVar2);
      if (live_mode_cb::live_widget != (Fl_Widget *)0x0) {
        live_mode_cb::live_type = &current_widget->super_Fl_Type;
        Fl_Group::current((Fl_Group *)0x0);
        iVar2 = live_mode_cb::live_widget->w_;
        iVar7 = live_mode_cb::live_widget->h_;
        pFVar4 = (Fl_Window *)operator_new(0xf0);
        Fl_Double_Window::Fl_Double_Window
                  ((Fl_Double_Window *)pFVar4,iVar2 + 0x14,iVar7 + 0x37,"Fluid Live Mode Widget");
        live_mode_cb::live_window = pFVar4;
        (pFVar4->super_Fl_Group).super_Fl_Widget.box_ = '\x01';
        (pFVar4->super_Fl_Group).super_Fl_Widget.color_ = 0x3f;
        this = (Fl_Group *)operator_new(0xa0);
        iVar7 = iVar7 + 0x14;
        Fl_Group::Fl_Group(this,0,iVar7,0x82,0x23,(char *)0x0);
        (this->super_Fl_Widget).box_ = '\0';
        this_00 = (Fl_Widget *)operator_new(0x78);
        Fl_Box::Fl_Box((Fl_Box *)this_00,0x6e,iVar7,1,0x19,(char *)0x0);
        this_00->box_ = '\0';
        this->resizable_ = this_00;
        pFVar5 = (Fl_Button *)operator_new(0x80);
        Fl_Button::Fl_Button(pFVar5,10,iVar7,100,0x19,"Exit Live Mode");
        (pFVar5->super_Fl_Widget).label_.size = 0xc;
        (pFVar5->super_Fl_Widget).callback_ = leave_live_mode_cb;
        Fl_Group::end(this);
        Fl_Group::add(&live_mode_cb::live_window->super_Fl_Group,live_mode_cb::live_widget);
        (*live_mode_cb::live_widget->_vptr_Fl_Widget[4])
                  (live_mode_cb::live_widget,10,10,(ulong)(uint)live_mode_cb::live_widget->w_,
                   (ulong)(uint)live_mode_cb::live_widget->h_);
        pFVar4 = live_mode_cb::live_window;
        (live_mode_cb::live_window->super_Fl_Group).resizable_ = live_mode_cb::live_widget;
        pbVar1 = (byte *)((long)&(pFVar4->super_Fl_Group).super_Fl_Widget.flags_ + 1);
        *pbVar1 = *pbVar1 | 0x40;
        (pFVar4->super_Fl_Group).super_Fl_Widget.callback_ = leave_live_mode_cb;
        iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])();
        pFVar4 = live_mode_cb::live_window;
        if (iVar2 != 0) {
          iVar2 = current_widget[1].super_Fl_Type.level;
          iVar7 = *(int *)&current_widget[1].super_Fl_Type.field_0x4c;
          iVar3 = iVar2 + 0x14;
          if (iVar2 < 1) {
            iVar3 = iVar2;
          }
          iVar2 = iVar7 + 0x37;
          if (iVar7 < 1) {
            iVar2 = iVar7;
          }
          iVar7 = *(int *)&current_widget[1].super_Fl_Type.next;
          iVar6 = iVar7 + 0x14;
          if (iVar7 < 1) {
            iVar6 = iVar7;
          }
          iVar7 = *(int *)((long)&current_widget[1].super_Fl_Type.next + 4);
          iVar8 = iVar7 + 0x37;
          if (iVar7 < 3) {
            iVar8 = iVar7;
          }
          if ((((iVar3 != 0) || (iVar2 != 0)) || (iVar6 != 0)) || (iVar8 != 0)) {
            live_mode_cb::live_window->minw = iVar3;
            pFVar4->minh = iVar2;
            pFVar4->maxw = iVar6;
            pFVar4->maxh = iVar8;
            pFVar4->dw = 0;
            pFVar4->dh = 0;
            pFVar4->aspect = 0;
            Fl_Window::size_range_(pFVar4);
          }
        }
        (*(live_mode_cb::live_window->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])();
        return;
      }
    }
    Fl_Button::value(o,0);
    return;
  }
  if (live_mode_cb::live_type != (Fl_Type *)0x0) {
    (*live_mode_cb::live_type->_vptr_Fl_Type[0x14])();
  }
  if (live_mode_cb::live_window != (Fl_Window *)0x0) {
    (*(live_mode_cb::live_window->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[6])();
    Fl::delete_widget((Fl_Widget *)live_mode_cb::live_window);
  }
  live_mode_cb::live_type = (Fl_Type *)0x0;
  live_mode_cb::live_widget = (Fl_Widget *)0x0;
  live_mode_cb::live_window = (Fl_Window *)0x0;
  return;
}

Assistant:

void live_mode_cb(Fl_Button*o,void *) {
  /// \todo live mode should end gracefully when the application quits
  ///       or when the user closes the live widget
  static Fl_Type *live_type = 0L;
  static Fl_Widget *live_widget = 0L;
  static Fl_Window *live_window = 0L;
  // if 'o' is 0, we must quit live mode
  if (!o) {
    o = wLiveMode;
    o->value(0);
  }
  if (o->value()) {
    if (numselected == 1) {
      Fl_Group::current(0L);
      live_widget = current_widget->enter_live_mode(1);
      if (live_widget) {
        live_type = current_widget;
        Fl_Group::current(0);
        int w = live_widget->w();
        int h = live_widget->h();
        live_window = new Fl_Double_Window(w+20, h+55, "Fluid Live Mode Widget");
        live_window->box(FL_FLAT_BOX);
        live_window->color(FL_GREEN);
        Fl_Group *rsz = new Fl_Group(0, h+20, 130, 35);
        rsz->box(FL_NO_BOX);
        Fl_Box *rsz_dummy = new Fl_Box(110, h+20, 1, 25);
        rsz_dummy->box(FL_NO_BOX);
        rsz->resizable(rsz_dummy);
        Fl_Button *btn = new Fl_Button(10, h+20, 100, 25, "Exit Live Mode");
        btn->labelsize(12);
        btn->callback(leave_live_mode_cb);
        rsz->end();
        live_window->add(live_widget);
        live_widget->position(10, 10);
        live_window->resizable(live_widget);
        live_window->set_modal(); // block all other UI
        live_window->callback(leave_live_mode_cb);
        if (current_widget->is_window()) {
          Fl_Window_Type *w = (Fl_Window_Type*)current_widget;
          int mw = w->sr_min_w; if (mw>0) mw += 20;
          int mh = w->sr_min_h; if (mh>0) mh += 55;
          int MW = w->sr_max_w; if (MW>0) MW += 20; 
          int MH = w->sr_max_h; if (MH>2) MH += 55;
          if (mw || mh || MW || MH)
            live_window->size_range(mw, mh, MW, MH);
        }
        live_window->show();
      } else o->value(0);
    } else o->value(0);
  } else {
    if (live_type)
      live_type->leave_live_mode();
    if (live_window) {
      live_window->hide();
      Fl::delete_widget(live_window);
    }
    live_type = 0L;
    live_widget = 0L;
    live_window = 0L;
  }
}